

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.h
# Opt level: O1

ostream * __thiscall wasm::Output::operator<<(Output *this,char **v)

{
  char *__s;
  size_t sVar1;
  ostream *poVar2;
  
  poVar2 = (ostream *)(this + 0x200);
  __s = *v;
  if (__s == (char *)0x0) {
    std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
  }
  else {
    sVar1 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,__s,sVar1);
  }
  return poVar2;
}

Assistant:

~Output() = default;